

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

QMenu * __thiscall QToolButton::menu(QToolButton *this)

{
  long lVar1;
  long lVar2;
  QMenu *pQVar3;
  
  lVar1 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  lVar2 = *(long *)(lVar1 + 0x2c8);
  if (((lVar2 != 0) && (*(int *)(lVar2 + 4) != 0)) && (*(long *)(lVar1 + 0x2d0) != 0)) {
    QAction::menuObject();
    pQVar3 = (QMenu *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
    return pQVar3;
  }
  return (QMenu *)0x0;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }